

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.h
# Opt level: O2

string * __thiscall
proto2_unittest::TestOneof2::_internal_mutable_foo_string_abi_cxx11_(TestOneof2 *this)

{
  string *psVar1;
  Arena *arena;
  
  if ((this->field_0)._impl_._oneof_case_[0] != 2) {
    clear_foo(this);
    (this->field_0)._impl_._oneof_case_[0] = 2;
    (this->field_0)._impl_.foo_.foo_message_ =
         (Message *)&google::protobuf::internal::fixed_address_empty_string;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  psVar1 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                     (&(this->field_0)._impl_.foo_.foo_string_,arena);
  return psVar1;
}

Assistant:

inline ::std::string* PROTOBUF_NONNULL TestOneof2::_internal_mutable_foo_string() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (foo_case() != kFooString) {
    clear_foo();

    set_has_foo_string();
    _impl_.foo_.foo_string_.InitDefault();
  }
  return _impl_.foo_.foo_string_.Mutable( GetArena());
}